

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::TriangleRenderer::TriangleRenderer
          (TriangleRenderer *this,DeviceInterface *vkd,VkDevice device,Allocator *allocator,
          BinaryCollection *binaryRegistry,
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
          *swapchainImages,VkFormat framebufferFormat,UVec2 *renderSize)

{
  VkRenderPass renderPass;
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)17>_> data_00;
  RefData<vk::Handle<(vk::HandleType)16>_> data_01;
  RefData<vk::Handle<(vk::HandleType)18>_> data_02;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)13>_> data_04;
  RefData<vk::Handle<(vk::HandleType)23>_> data_05;
  ulong uVar2;
  Allocator *pAVar3;
  VkDevice pVVar4;
  VkResult VVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)16> *pHVar7;
  Handle<(vk::HandleType)8> *pHVar8;
  size_type sVar9;
  Unique<vk::Handle<(vk::HandleType)13>_> *this_00;
  const_reference pvVar10;
  reference pvVar11;
  Unique<vk::Handle<(vk::HandleType)23>_> *this_01;
  RefBase<vk::Handle<(vk::HandleType)13>_> *this_02;
  Handle<(vk::HandleType)13> *pHVar12;
  reference this_03;
  Allocation *pAVar13;
  VkDeviceMemory VVar14;
  VkDeviceSize VVar15;
  void *dst;
  MovePtr *this_04;
  undefined1 local_2d8 [8];
  Vec4 vertices [3];
  VkMappedMemoryRange memRange;
  Move<vk::Handle<(vk::HandleType)23>_> local_258;
  RefData<vk::Handle<(vk::HandleType)23>_> local_238;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> local_218;
  undefined1 local_201;
  deUint64 local_200;
  Move<vk::Handle<(vk::HandleType)13>_> local_1f8;
  RefData<vk::Handle<(vk::HandleType)13>_> local_1d8;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_1b8;
  ulong local_1a8;
  size_t imageNdx;
  deUint64 local_198;
  VkMemoryRequirements local_190;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_178;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_168;
  Move<vk::Handle<(vk::HandleType)8>_> local_158;
  RefData<vk::Handle<(vk::HandleType)8>_> local_138;
  deUint64 local_118;
  VkRenderPass local_110;
  Move<vk::Handle<(vk::HandleType)18>_> local_108;
  RefData<vk::Handle<(vk::HandleType)18>_> local_e8;
  Move<vk::Handle<(vk::HandleType)16>_> local_c8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_a8;
  Move<vk::Handle<(vk::HandleType)17>_> local_88;
  RefData<vk::Handle<(vk::HandleType)17>_> local_68;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *local_38;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  *swapchainImages_local;
  BinaryCollection *binaryRegistry_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  TriangleRenderer *this_local;
  
  this->m_vkd = vkd;
  local_38 = swapchainImages;
  swapchainImages_local =
       (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *)
       binaryRegistry;
  binaryRegistry_local = (BinaryCollection *)allocator;
  allocator_local = (Allocator *)device;
  device_local = (VkDevice)vkd;
  vkd_local = (DeviceInterface *)this;
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&this->m_swapchainImages,swapchainImages);
  tcu::Vector<unsigned_int,_2>::Vector(&this->m_renderSize,renderSize);
  createRenderPass(&local_88,(DeviceInterface *)device_local,(VkDevice)allocator_local,
                   framebufferFormat);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_68,(Move *)&local_88);
  data_00.deleter.m_deviceIface = local_68.deleter.m_deviceIface;
  data_00.object.m_internal = local_68.object.m_internal;
  data_00.deleter.m_device = local_68.deleter.m_device;
  data_00.deleter.m_allocator = local_68.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique(&this->m_renderPass,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_88);
  createPipelineLayout(&local_c8,(DeviceInterface *)device_local,(VkDevice)allocator_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a8,(Move *)&local_c8);
  data_01.deleter.m_deviceIface = local_a8.deleter.m_deviceIface;
  data_01.object.m_internal = local_a8.object.m_internal;
  data_01.deleter.m_device = local_a8.deleter.m_device;
  data_01.deleter.m_allocator = local_a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique(&this->m_pipelineLayout,data_01)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_c8);
  pVVar4 = device_local;
  pAVar3 = allocator_local;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_110.m_internal = pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_118 = pHVar7->m_internal;
  createPipeline(&local_108,(DeviceInterface *)pVVar4,(VkDevice)pAVar3,local_110,
                 (VkPipelineLayout)local_118,(BinaryCollection *)swapchainImages_local,renderSize);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data_02.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_02.object.m_internal = local_e8.object.m_internal;
  data_02.deleter.m_device = local_e8.deleter.m_device;
  data_02.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique(&this->m_pipeline,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_108);
  createBuffer(&local_158,(DeviceInterface *)device_local,(VkDevice)allocator_local,0x30,0x80);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  data_03.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data_03.object.m_internal = local_138.object.m_internal;
  data_03.deleter.m_device = local_138.deleter.m_device;
  data_03.deleter.m_allocator = local_138.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_vertexBuffer,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_158);
  pVVar4 = device_local;
  pAVar3 = allocator_local;
  this_04 = (MovePtr *)binaryRegistry_local;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_198 = pHVar8->m_internal;
  ::vk::getBufferMemoryRequirements
            (&local_190,(DeviceInterface *)pVVar4,(VkDevice)pAVar3,(VkBuffer)local_198);
  imageNdx._4_4_ = ::vk::MemoryRequirement::HostVisible;
  (**(code **)(*(long *)&(((BinaryCollection *)this_04)->m_programs)._M_t._M_impl + 0x18))
            (&local_178,this_04,&local_190,::vk::MemoryRequirement::HostVisible);
  local_168 = de::details::MovePtr::operator_cast_to_PtrData(&local_178,this_04);
  data._8_8_ = local_138.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_138.object.m_internal;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_vertexBufferMemory,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_178);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector(&this->m_attachmentViews);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::vector(&this->m_framebuffers);
  sVar9 = std::
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
          size(swapchainImages);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::resize(&this->m_attachmentViews,sVar9);
  sVar9 = std::
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
          size(swapchainImages);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::resize(&this->m_framebuffers,sVar9);
  local_1a8 = 0;
  while( true ) {
    uVar2 = local_1a8;
    sVar9 = std::
            vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
            size(swapchainImages);
    pVVar4 = device_local;
    pAVar3 = allocator_local;
    if (sVar9 <= uVar2) break;
    this_00 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    pVVar4 = device_local;
    pAVar3 = allocator_local;
    local_201 = 1;
    pvVar10 = std::
              vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              ::operator[](swapchainImages,local_1a8);
    local_200 = pvVar10->m_internal;
    createAttachmentView
              (&local_1f8,(DeviceInterface *)pVVar4,(VkDevice)pAVar3,(VkImage)local_200,
               framebufferFormat);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)&local_1f8);
    data_04.deleter.m_deviceIface = local_1d8.deleter.m_deviceIface;
    data_04.object.m_internal = local_1d8.object.m_internal;
    data_04.deleter.m_device = local_1d8.deleter.m_device;
    data_04.deleter.m_allocator = local_1d8.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique(this_00,data_04);
    local_201 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
              (&local_1b8,this_00);
    pvVar11 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&this->m_attachmentViews,local_1a8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              (pvVar11,&local_1b8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_1b8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_1f8);
    this_01 = (Unique<vk::Handle<(vk::HandleType)23>_> *)operator_new(0x20);
    pVVar4 = device_local;
    pAVar3 = allocator_local;
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                       (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
    renderPass.m_internal = pHVar6->m_internal;
    pvVar11 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&this->m_attachmentViews,local_1a8);
    this_02 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (pvVar11)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(this_02);
    createFramebuffer(&local_258,(DeviceInterface *)pVVar4,(VkDevice)pAVar3,renderPass,
                      (VkImageView)pHVar12->m_internal,renderSize);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_238,(Move *)&local_258);
    data_05.deleter.m_deviceIface = local_238.deleter.m_deviceIface;
    data_05.object.m_internal = local_238.object.m_internal;
    data_05.deleter.m_device = local_238.deleter.m_device;
    data_05.deleter.m_allocator = local_238.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique(this_01,data_05);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::SharedPtr
              (&local_218,this_01);
    this_03 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
              ::operator[](&this->m_framebuffers,local_1a8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::operator=
              (this_03,&local_218);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::~SharedPtr(&local_218);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_258);
    local_1a8 = local_1a8 + 1;
  }
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar1 = pHVar8->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar15 = ::vk::Allocation::getOffset(pAVar13);
  VVar5 = (**(code **)(*(long *)pVVar4 + 0x60))(pVVar4,pAVar3,dVar1,VVar14.m_internal,VVar15);
  ::vk::checkResult(VVar5,
                    "vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x49f);
  vertices[2].m_data[2] = 8.40779e-45;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::Allocation::getOffset(pAVar13);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_2d8,-0.5,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices[0].m_data + 2),0.5,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices[1].m_data + 2),0.0,0.5,0.0,1.0);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  dst = ::vk::Allocation::getHostPtr(pAVar13);
  ::deMemcpy(dst,local_2d8,0x30);
  VVar5 = (**(code **)(*(long *)device_local + 0x48))
                    (device_local,allocator_local,1,vertices[2].m_data + 2);
  ::vk::checkResult(VVar5,"vkd.flushMappedMemoryRanges(device, 1u, &memRange)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4b3);
  return;
}

Assistant:

TriangleRenderer::TriangleRenderer (const DeviceInterface&	vkd,
									const VkDevice			device,
									Allocator&				allocator,
									const BinaryCollection&	binaryRegistry,
									const vector<VkImage>	swapchainImages,
									const VkFormat			framebufferFormat,
									const UVec2&			renderSize)
	: m_vkd					(vkd)
	, m_swapchainImages		(swapchainImages)
	, m_renderSize			(renderSize)
	, m_renderPass			(createRenderPass(vkd, device, framebufferFormat))
	, m_pipelineLayout		(createPipelineLayout(vkd, device))
	, m_pipeline			(createPipeline(vkd, device, *m_renderPass, *m_pipelineLayout, binaryRegistry, renderSize))
	, m_vertexBuffer		(createBuffer(vkd, device, (VkDeviceSize)(sizeof(float)*4*3), VK_BUFFER_USAGE_VERTEX_BUFFER_BIT))
	, m_vertexBufferMemory	(allocator.allocate(getBufferMemoryRequirements(vkd, device, *m_vertexBuffer),
							 MemoryRequirement::HostVisible))
{
	m_attachmentViews.resize(swapchainImages.size());
	m_framebuffers.resize(swapchainImages.size());

	for (size_t imageNdx = 0; imageNdx < swapchainImages.size(); ++imageNdx)
	{
		m_attachmentViews[imageNdx]	= ImageViewSp(new Unique<VkImageView>(createAttachmentView(vkd, device, swapchainImages[imageNdx], framebufferFormat)));
		m_framebuffers[imageNdx]	= FramebufferSp(new Unique<VkFramebuffer>(createFramebuffer(vkd, device, *m_renderPass, **m_attachmentViews[imageNdx], renderSize)));
	}

	VK_CHECK(vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset()));

	{
		const VkMappedMemoryRange	memRange	=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
			DE_NULL,
			m_vertexBufferMemory->getMemory(),
			m_vertexBufferMemory->getOffset(),
			VK_WHOLE_SIZE
		};
		const tcu::Vec4				vertices[]	=
		{
			tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
		};
		DE_STATIC_ASSERT(sizeof(vertices) == sizeof(float)*4*3);

		deMemcpy(m_vertexBufferMemory->getHostPtr(), &vertices[0], sizeof(vertices));
		VK_CHECK(vkd.flushMappedMemoryRanges(device, 1u, &memRange));
	}
}